

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O1

void __thiscall UnifiedRegex::DebugWriter::PrintEOL(DebugWriter *this,Char *form,...)

{
  char in_AL;
  uint uVar1;
  int *piVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list argptr;
  
  argptr[0].overflow_arg_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  argptr[0]._0_8_ = &stack0x00000008;
  local_38._0_4_ = 0x10;
  local_38._4_4_ = 0x30;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar1 = _vsnwprintf(this->buf,0x800,form,(__va_list_tag *)local_38);
  this->buf[0x7ff] = L'\0';
  if ((int)uVar1 < 0) {
    piVar2 = PAL_errno(0);
    if (*piVar2 == 0) {
      piVar2 = PAL_errno(0);
      *piVar2 = 0x22;
    }
  }
  if (uVar1 < 0x7ff) {
    if ((uVar1 != 0) && (this->nlPending == true)) {
      Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
      this->nlPending = false;
    }
    Output::Print(L"%s",this);
  }
  else {
    Output::Print(L"<not enough buffer space to format>");
  }
  if (this->nlPending == true) {
    Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
    this->nlPending = false;
  }
  this->nlPending = true;
  return;
}

Assistant:

void __cdecl DebugWriter::PrintEOL(const Char *form, ...)
    {
        PRINT_DEBUG_WRITER();
        EOL();
    }